

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_enc_utils.c
# Opt level: O1

MPP_RET mpi_enc_gen_osd_data
                  (MppEncOSDData *osd_data,MppBufferGroup group,RK_U32 width,RK_U32 height,
                  RK_U32 frame_cnt)

{
  uint uVar1;
  long lVar3;
  uint uVar4;
  int __c;
  uint uVar5;
  uint uVar6;
  RK_U32 region_size;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  RK_U32 *pRVar14;
  MppBuffer buf;
  MppBuffer local_50;
  ulong local_48;
  ulong local_40;
  MppBufferGroup local_38;
  ulong uVar2;
  
  uVar7 = width + 0xf >> 4;
  uVar1 = height + 0xf >> 4;
  uVar2 = (ulong)uVar1;
  uVar13 = uVar7 + 7 >> 3;
  uVar8 = uVar1 + 0xf >> 4;
  uVar4 = 0;
  uVar10 = (ulong)(uVar13 * frame_cnt) % (ulong)uVar7;
  uVar12 = (ulong)(frame_cnt * uVar8) % uVar2;
  local_50 = osd_data->buf;
  uVar1 = 0;
  local_38 = group;
  if (local_50 != (MppBuffer)0x0) {
    local_48 = (ulong)uVar7;
    local_40 = uVar2;
    uVar1 = mpp_buffer_get_size_with_caller(local_50,"mpi_enc_gen_osd_data");
    uVar7 = (uint)local_48;
    uVar2 = local_40;
  }
  osd_data->num_region = 8;
  lVar3 = 0x24;
  do {
    *(int *)((long)(osd_data->region + -1) + lVar3) = (int)uVar10;
    *(int *)((long)osd_data->region + lVar3 + -0x18) = (int)uVar12;
    *(uint *)((long)osd_data->region + lVar3 + -0x14) = uVar13;
    *(uint *)((long)osd_data->region + lVar3 + -0x10) = uVar8;
    *(uint *)((long)osd_data->region + lVar3 + -0xc) = uVar4;
    *(undefined8 *)((long)osd_data->region + lVar3 + -0x24) = 0x100000001;
    uVar9 = (int)uVar10 + uVar13;
    uVar6 = 0;
    if (uVar7 <= uVar9) {
      uVar6 = uVar7;
    }
    uVar11 = (int)uVar12 + uVar8;
    uVar5 = 0;
    if ((uint)uVar2 <= uVar11) {
      uVar5 = (uint)uVar2;
    }
    uVar4 = uVar4 + uVar13 * uVar8 * 0x100;
    uVar10 = (ulong)(uVar9 - uVar6);
    uVar12 = (ulong)(uVar11 - uVar5);
    lVar3 = lVar3 + 0x1c;
  } while ((int)lVar3 != 0x104);
  if (uVar1 < uVar4) {
    if (local_50 != (MppBuffer)0x0) {
      mpp_buffer_put_with_caller(local_50,"mpi_enc_gen_osd_data");
    }
    mpp_buffer_get_with_tag(local_38,&local_50,uVar4,"mpi_enc_utils","mpi_enc_gen_osd_data");
    if (local_50 == (MppBuffer)0x0) {
      _mpp_log_l(2,"mpi_enc_utils","failed to create osd buffer size %d\n","mpi_enc_gen_osd_data",
                 uVar4);
    }
  }
  if (local_50 != (MppBuffer)0x0) {
    lVar3 = mpp_buffer_get_ptr_with_caller(local_50,"mpi_enc_gen_osd_data");
    pRVar14 = &osd_data->region[0].buf_offset;
    __c = 0;
    do {
      memset((void *)((ulong)*pRVar14 + lVar3),__c,(ulong)(pRVar14[-2] * pRVar14[-1] * 0x100));
      __c = __c + 1;
      pRVar14 = pRVar14 + 7;
    } while (__c != 8);
  }
  osd_data->buf = local_50;
  return MPP_OK;
}

Assistant:

MPP_RET mpi_enc_gen_osd_data(MppEncOSDData *osd_data, MppBufferGroup group,
                             RK_U32 width, RK_U32 height, RK_U32 frame_cnt)
{
    MppEncOSDRegion *region = NULL;
    RK_U32 k = 0;
    RK_U32 num_region = 8;
    RK_U32 buf_offset = 0;
    RK_U32 buf_size = 0;
    RK_U32 mb_w_max = MPP_ALIGN(width, 16) / 16;
    RK_U32 mb_h_max = MPP_ALIGN(height, 16) / 16;
    RK_U32 step_x = MPP_ALIGN(mb_w_max, 8) / 8;
    RK_U32 step_y = MPP_ALIGN(mb_h_max, 16) / 16;
    RK_U32 mb_x = (frame_cnt * step_x) % mb_w_max;
    RK_U32 mb_y = (frame_cnt * step_y) % mb_h_max;
    RK_U32 mb_w = step_x;
    RK_U32 mb_h = step_y;
    MppBuffer buf = osd_data->buf;

    if (buf)
        buf_size = mpp_buffer_get_size(buf);

    /* generate osd region info */
    osd_data->num_region = num_region;

    region = osd_data->region;

    for (k = 0; k < num_region; k++, region++) {
        // NOTE: offset must be 16 byte aligned
        RK_U32 region_size = MPP_ALIGN(mb_w * mb_h * 256, 16);

        region->inverse = 1;
        region->start_mb_x = mb_x;
        region->start_mb_y = mb_y;
        region->num_mb_x = mb_w;
        region->num_mb_y = mb_h;
        region->buf_offset = buf_offset;
        region->enable = (mb_w && mb_h);

        buf_offset += region_size;

        mb_x += step_x;
        mb_y += step_y;
        if (mb_x >= mb_w_max)
            mb_x -= mb_w_max;
        if (mb_y >= mb_h_max)
            mb_y -= mb_h_max;
    }

    /* create buffer and write osd index data */
    if (buf_size < buf_offset) {
        if (buf)
            mpp_buffer_put(buf);

        mpp_buffer_get(group, &buf, buf_offset);
        if (NULL == buf)
            mpp_err_f("failed to create osd buffer size %d\n", buf_offset);
    }

    if (buf) {
        void *ptr = mpp_buffer_get_ptr(buf);
        region = osd_data->region;

        for (k = 0; k < num_region; k++, region++) {
            mb_w = region->num_mb_x;
            mb_h = region->num_mb_y;
            buf_offset = region->buf_offset;

            memset(ptr + buf_offset, k, mb_w * mb_h * 256);
        }
    }

    osd_data->buf = buf;

    return MPP_OK;
}